

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::UnorderedArrayList
          (UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL> *this,SlabAllocator *alloc)

{
  SnapType *pSVar1;
  
  this->m_alloc = alloc;
  pSVar1 = SlabAllocatorBase<0>::SlabAllocateFixedSizeArray<TTD::NSSnapType::SnapType,2048ul>(alloc)
  ;
  (this->m_inlineHeadBlock).BlockData = pSVar1;
  (this->m_inlineHeadBlock).CurrPos = pSVar1;
  (this->m_inlineHeadBlock).EndPos = pSVar1 + 0x800;
  (this->m_inlineHeadBlock).Next = (UnorderedArrayListLink *)0x0;
  return;
}

Assistant:

UnorderedArrayList(SlabAllocator* alloc)
            : m_alloc(alloc)
        {
            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = nullptr;
        }